

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O3

void emit_rr(ASMState *as,x86Op xo,Reg r1,Reg r2)

{
  MCode *pMVar1;
  uint uVar2;
  byte bVar3;
  byte *pbVar4;
  int iVar5;
  
  pMVar1 = as->mcp;
  pMVar1[-1] = ((byte)r2 & 7) + (char)r1 * '\b' | 0xc0;
  iVar5 = xo << 0x18;
  if (iVar5 == -0x3c000000) {
    *(x86Op *)(pMVar1 + -5) = (r2 >> 3 & 1 | r1 >> 1 & 4) << 0xd ^ xo;
    pbVar4 = pMVar1 + -5;
  }
  else {
    *(x86Op *)(pMVar1 + -5) = xo;
    pbVar4 = pMVar1 + (iVar5 >> 0x18);
    uVar2 = r2 >> 3 & 1 | r1 >> 1 & 0x104;
    if (uVar2 != 0) {
      bVar3 = (byte)(r1 >> 0x10) | (byte)uVar2 | 0x40;
      if (iVar5 == -0x4000000) {
        *pbVar4 = bVar3;
        bVar3 = (byte)(xo >> 8);
      }
      else if ((xo & 0xffffff) == 0x6600fd) {
        *pbVar4 = bVar3;
        bVar3 = 0x66;
      }
      pbVar4[-1] = bVar3;
      pbVar4 = pbVar4 + -1;
    }
  }
  as->mcp = pbVar4;
  return;
}

Assistant:

static void emit_rr(ASMState *as, x86Op xo, Reg r1, Reg r2)
{
  MCode *p = as->mcp;
  as->mcp = emit_opm(xo, XM_REG, r1, r2, p, 0);
}